

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void read_log_toptenentry(int fd,nh_topten_entry *entry)

{
  char *line_00;
  char *line;
  undefined1 local_d8 [4];
  int size;
  toptenentry tt;
  nh_topten_entry *entry_local;
  int fd_local;
  
  tt.death._92_8_ = entry;
  line_00 = loadfile(fd,(int *)((long)&line + 4));
  if (line_00 != (char *)0x0) {
    readentry(line_00,(toptenentry *)local_d8);
    fill_nh_score_entry((toptenentry *)local_d8,(nh_topten_entry *)tt.death._92_8_,-1,'\0');
    free(line_00);
  }
  return;
}

Assistant:

void read_log_toptenentry(int fd, struct nh_topten_entry *entry)
{
    struct toptenentry tt;
    int size;
    char *line = loadfile(fd, &size);
    if (!line)
	return;
    
    readentry(line, &tt);
    fill_nh_score_entry(&tt, entry, -1, FALSE);
    free(line);
}